

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pai.c
# Opt level: O0

void duckdb_je_pai_dalloc_batch_default
               (tsdn_t *tsdn,pai_t *self,edata_list_active_t *list,_Bool *deferred_work_generated)

{
  edata_t *item;
  tsdn_t *in_RCX;
  edata_list_active_t *in_RDX;
  _Bool deferred_by_dalloc;
  edata_t *edata;
  _Bool *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  byte bVar1;
  
  while( true ) {
    item = edata_list_active_first(in_RDX);
    if (item == (edata_t *)0x0) break;
    bVar1 = 0;
    edata_list_active_remove(in_RDX,item);
    pai_dalloc(in_RCX,(pai_t *)item,(edata_t *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
    (in_RCX->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled =
         ((in_RCX->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled & 1U)
         != 0 || (bVar1 & 1) != 0;
  }
  return;
}

Assistant:

void
pai_dalloc_batch_default(tsdn_t *tsdn, pai_t *self,
    edata_list_active_t *list, bool *deferred_work_generated) {
	edata_t *edata;
	while ((edata = edata_list_active_first(list)) != NULL) {
		bool deferred_by_dalloc = false;
		edata_list_active_remove(list, edata);
		pai_dalloc(tsdn, self, edata, &deferred_by_dalloc);
		*deferred_work_generated |= deferred_by_dalloc;
	}
}